

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O2

Atomic * rw::Atomic::create(void)

{
  uint8 *puVar1;
  FILE *__stream;
  Atomic *this;
  char *pcVar2;
  Error _e;
  Error local_20;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp line: 414"
  ;
  this = (Atomic *)(*Engine::memfuncs)((long)(int)s_plglist);
  if (this == (Atomic *)0x0) {
    local_20.plugin = 2;
    local_20.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp"
            ,0x1a0);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&local_20);
  }
  else {
    numAllocated = numAllocated + 1;
    (this->object).object.type = '\x01';
    (this->object).object.subType = '\0';
    (this->object).object.flags = '\0';
    (this->object).object.privateFlags = '\0';
    (this->object).object.parent = (void *)0x0;
    (this->object).syncCB = atomicSync;
    this->geometry = (Geometry *)0x0;
    (this->boundingSphere).center.x = 0.0;
    (this->boundingSphere).center.y = 0.0;
    *(undefined8 *)&(this->boundingSphere).center.z = 0;
    (this->worldBoundingSphere).center.x = 0.0;
    (this->worldBoundingSphere).center.y = 0.0;
    *(undefined8 *)&(this->worldBoundingSphere).center.z = 0;
    setFrame(this,(Frame *)0x0);
    puVar1 = &(this->object).object.privateFlags;
    *puVar1 = *puVar1 | 1;
    this->clump = (Clump *)0x0;
    (this->inClump).next = (LLLink *)0x0;
    (this->inClump).prev = (LLLink *)0x0;
    this->pipeline = (ObjPipeline *)0x0;
    this->renderCB = defaultRenderCB;
    (this->object).object.flags = '\x05';
    this->world = (World *)0x0;
    this->originalSync = (this->object).syncCB;
    (this->object).syncCB = worldAtomicSync;
    PluginList::construct((PluginList *)&s_plglist,this);
  }
  return this;
}

Assistant:

Atomic*
Atomic::create(void)
{
	Atomic *atomic = (Atomic*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_ATOMIC);
	if(atomic == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	atomic->object.object.init(Atomic::ID, 0);
	atomic->object.syncCB = atomicSync;
	atomic->geometry = nil;
	atomic->boundingSphere.center.set(0.0f, 0.0f, 0.0f);
	atomic->boundingSphere.radius = 0.0f;
	atomic->worldBoundingSphere.center.set(0.0f, 0.0f, 0.0f);
	atomic->worldBoundingSphere.radius = 0.0f;
	atomic->setFrame(nil);
	atomic->object.object.privateFlags |= WORLDBOUNDDIRTY;
	atomic->clump = nil;
	atomic->inClump.init();
	atomic->pipeline = nil;
	atomic->renderCB = Atomic::defaultRenderCB;
	atomic->object.object.flags = Atomic::COLLISIONTEST | Atomic::RENDER;
	// TODO: interpolator

	// World extension
	atomic->world = nil;
	atomic->originalSync = atomic->object.syncCB;
	atomic->object.syncCB = worldAtomicSync;

	s_plglist.construct(atomic);
	return atomic;
}